

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool ra_range_uint32_array(roaring_array_t *ra,size_t offset,size_t limit,uint32_t *ans)

{
  uint8_t uVar1;
  bool bVar2;
  int iVar3;
  run_container_t *run;
  void *__s;
  uint32_t *append_ans;
  container_t *c;
  ulong uStack_68;
  int i;
  size_t cur_len;
  uint32_t *t_ans;
  size_t first_skip;
  long lStack_48;
  _Bool first;
  size_t t_limit;
  size_t dtr;
  size_t ctr;
  uint32_t *ans_local;
  size_t limit_local;
  size_t offset_local;
  roaring_array_t *ra_local;
  
  dtr = 0;
  t_limit = 0;
  lStack_48 = 0;
  bVar2 = false;
  t_ans = (uint32_t *)0x0;
  cur_len = 0;
  uStack_68 = 0;
  for (c._4_4_ = 0; c._4_4_ < ra->size; c._4_4_ = c._4_4_ + 1) {
    run = (run_container_t *)
          container_unwrap_shared(ra->containers[c._4_4_],ra->typecodes + c._4_4_);
    uVar1 = ra->typecodes[c._4_4_];
    if (uVar1 == '\x01') {
      lStack_48 = (long)run->n_runs;
    }
    else if (uVar1 == '\x02') {
      lStack_48 = (long)run->n_runs;
    }
    else if (uVar1 == '\x03') {
      iVar3 = run_container_cardinality(run);
      lStack_48 = (long)iVar3;
    }
    if ((offset <= (dtr + lStack_48) - 1) && (dtr < offset + limit)) {
      if (!bVar2) {
        t_ans = (uint32_t *)(offset - dtr);
        bVar2 = true;
        cur_len = (size_t)malloc(((long)t_ans + limit) * 4);
        if ((void *)cur_len == (void *)0x0) {
          return false;
        }
        memset((void *)cur_len,0,((long)t_ans + limit) * 4);
        uStack_68 = (long)t_ans + limit;
      }
      if (uStack_68 < t_limit + lStack_48) {
        __s = malloc((uStack_68 + lStack_48) * 4);
        if (__s == (void *)0x0) {
          if (cur_len != 0) {
            free((void *)cur_len);
          }
          return false;
        }
        memset(__s,0,(uStack_68 + lStack_48) * 4);
        uStack_68 = uStack_68 + lStack_48;
        memcpy(__s,(void *)cur_len,t_limit << 2);
        free((void *)cur_len);
        cur_len = (size_t)__s;
      }
      uVar1 = ra->typecodes[c._4_4_];
      if (uVar1 == '\x01') {
        container_to_uint32_array
                  ((uint32_t *)(cur_len + t_limit * 4),run,ra->typecodes[c._4_4_],
                   (uint)ra->keys[c._4_4_] << 0x10);
      }
      else if (uVar1 == '\x02') {
        container_to_uint32_array
                  ((uint32_t *)(cur_len + t_limit * 4),run,ra->typecodes[c._4_4_],
                   (uint)ra->keys[c._4_4_] << 0x10);
      }
      else if (uVar1 == '\x03') {
        container_to_uint32_array
                  ((uint32_t *)(cur_len + t_limit * 4),run,ra->typecodes[c._4_4_],
                   (uint)ra->keys[c._4_4_] << 0x10);
      }
      t_limit = lStack_48 + t_limit;
    }
    dtr = lStack_48 + dtr;
    if (limit <= t_limit - (long)t_ans) break;
  }
  if (cur_len != 0) {
    memcpy(ans,(void *)(cur_len + (long)t_ans * 4),limit << 2);
    free((void *)cur_len);
  }
  return true;
}

Assistant:

bool ra_range_uint32_array(const roaring_array_t *ra, size_t offset, size_t limit, uint32_t *ans) {
    size_t ctr = 0;
    size_t dtr = 0;

    size_t t_limit = 0;

    bool first = false;
    size_t first_skip = 0;

    uint32_t *t_ans = NULL;
    size_t cur_len = 0;

    for (int i = 0; i < ra->size; ++i) {

        const container_t *c = container_unwrap_shared(
                                        ra->containers[i], &ra->typecodes[i]);
        switch (ra->typecodes[i]) {
            case BITSET_CONTAINER_TYPE:
                t_limit = (const_CAST_bitset(c))->cardinality;
                break;
            case ARRAY_CONTAINER_TYPE:
                t_limit = (const_CAST_array(c))->cardinality;
                break;
            case RUN_CONTAINER_TYPE:
                t_limit = run_container_cardinality(const_CAST_run(c));
                break;
        }
        if (ctr + t_limit - 1 >= offset && ctr < offset + limit){
            if (!first){
                //first_skip = t_limit - (ctr + t_limit - offset);
                first_skip = offset - ctr;
                first = true;
                t_ans = (uint32_t *)malloc(sizeof(*t_ans) * (first_skip + limit));
                if(t_ans == NULL) {
                  return false;
                }
                memset(t_ans, 0, sizeof(*t_ans) * (first_skip + limit)) ;
                cur_len = first_skip + limit;
            }
            if (dtr + t_limit > cur_len){
                uint32_t * append_ans = (uint32_t *)malloc(sizeof(*append_ans) * (cur_len + t_limit));
                if(append_ans == NULL) {
                  if(t_ans != NULL) free(t_ans);
                  return false;
                }
                memset(append_ans, 0, sizeof(*append_ans) * (cur_len + t_limit));
                cur_len = cur_len + t_limit;
                memcpy(append_ans, t_ans, dtr * sizeof(uint32_t));
                free(t_ans);
                t_ans = append_ans;
            }
            switch (ra->typecodes[i]) {
                case BITSET_CONTAINER_TYPE:
                    container_to_uint32_array(
                        t_ans + dtr,
                        const_CAST_bitset(c),  ra->typecodes[i],
                        ((uint32_t)ra->keys[i]) << 16);
                    break;
                case ARRAY_CONTAINER_TYPE:
                    container_to_uint32_array(
                        t_ans + dtr,
                        const_CAST_array(c), ra->typecodes[i],
                        ((uint32_t)ra->keys[i]) << 16);
                    break;
                case RUN_CONTAINER_TYPE:
                    container_to_uint32_array(
                        t_ans + dtr,
                        const_CAST_run(c), ra->typecodes[i],
                        ((uint32_t)ra->keys[i]) << 16);
                    break;
            }
            dtr += t_limit;
        }
        ctr += t_limit;
        if (dtr-first_skip >= limit) break;
    }
    if(t_ans != NULL) {
      memcpy(ans, t_ans+first_skip, limit * sizeof(uint32_t));
      free(t_ans);
    }
    return true;
}